

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask sqlite3ExprColUsed(Expr *pExpr)

{
  Bitmask BVar1;
  short sVar2;
  long in_RSI;
  Table *pExTab;
  short sVar3;
  
  sVar3 = (short)pExpr;
  if (((*(byte *)(in_RSI + 0x30) & 0x60) != 0) &&
     ((*(byte *)(*(long *)(in_RSI + 8) + 0xe + (long)sVar3 * 0x10) & 0x60) != 0)) {
    BVar1 = ~(-1L << ((byte)*(short *)(in_RSI + 0x36) & 0x3f));
    if (0x3f < *(short *)(in_RSI + 0x36)) {
      BVar1 = 0xffffffffffffffff;
    }
    return BVar1;
  }
  sVar2 = 0x3f;
  if (sVar3 < 0x3f) {
    sVar2 = sVar3;
  }
  return 1L << ((byte)sVar2 & 0x3f);
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3ExprColUsed(Expr *pExpr){
  int n;
  Table *pExTab;

  n = pExpr->iColumn;
  assert( ExprUseYTab(pExpr) );
  pExTab = pExpr->y.pTab;
  assert( pExTab!=0 );
  assert( n < pExTab->nCol );
  if( (pExTab->tabFlags & TF_HasGenerated)!=0
   && (pExTab->aCol[n].colFlags & COLFLAG_GENERATED)!=0
  ){
    testcase( pExTab->nCol==BMS-1 );
    testcase( pExTab->nCol==BMS );
    return pExTab->nCol>=BMS ? ALLBITS : MASKBIT(pExTab->nCol)-1;
  }else{
    testcase( n==BMS-1 );
    testcase( n==BMS );
    if( n>=BMS ) n = BMS-1;
    return ((Bitmask)1)<<n;
  }
}